

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_util.h
# Opt level: O3

void google::protobuf::
     STLDeleteElements<std::vector<google::protobuf::TextFormat::ParseInfoTree*,std::allocator<google::protobuf::TextFormat::ParseInfoTree*>>>
               (vector<google::protobuf::TextFormat::ParseInfoTree_*,_std::allocator<google::protobuf::TextFormat::ParseInfoTree_*>_>
                *container)

{
  pointer ppPVar1;
  ParseInfoTree *this;
  pointer ppPVar2;
  
  if (container !=
      (vector<google::protobuf::TextFormat::ParseInfoTree_*,_std::allocator<google::protobuf::TextFormat::ParseInfoTree_*>_>
       *)0x0) {
    ppPVar2 = (container->
              super__Vector_base<google::protobuf::TextFormat::ParseInfoTree_*,_std::allocator<google::protobuf::TextFormat::ParseInfoTree_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    ppPVar1 = (container->
              super__Vector_base<google::protobuf::TextFormat::ParseInfoTree_*,_std::allocator<google::protobuf::TextFormat::ParseInfoTree_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if (ppPVar2 != ppPVar1) {
      do {
        this = *ppPVar2;
        if (this != (ParseInfoTree *)0x0) {
          TextFormat::ParseInfoTree::~ParseInfoTree(this);
        }
        ppPVar2 = ppPVar2 + 1;
        operator_delete(this,0x60);
      } while (ppPVar2 != ppPVar1);
      ppPVar2 = (container->
                super__Vector_base<google::protobuf::TextFormat::ParseInfoTree_*,_std::allocator<google::protobuf::TextFormat::ParseInfoTree_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if ((container->
          super__Vector_base<google::protobuf::TextFormat::ParseInfoTree_*,_std::allocator<google::protobuf::TextFormat::ParseInfoTree_*>_>
          )._M_impl.super__Vector_impl_data._M_finish != ppPVar2) {
        (container->
        super__Vector_base<google::protobuf::TextFormat::ParseInfoTree_*,_std::allocator<google::protobuf::TextFormat::ParseInfoTree_*>_>
        )._M_impl.super__Vector_impl_data._M_finish = ppPVar2;
      }
    }
  }
  return;
}

Assistant:

void STLDeleteElements(T *container) {
  if (!container) return;
  STLDeleteContainerPointers(container->begin(), container->end());
  container->clear();
}